

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts3Incrmerge(Fts3Table *p,int nMerge,int nMin)

{
  long *plVar1;
  i64 *pnByte;
  Fts3MultiSegReader *pCsr;
  undefined8 *puVar2;
  Blob *pBlob;
  int *piVar3;
  byte bVar4;
  bool bVar5;
  undefined8 uVar6;
  sqlite3_stmt *pStmt;
  char *pcVar7;
  sqlite3_int64 iValue;
  bool bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int *__s;
  void *pvVar18;
  ulong uVar19;
  long lVar20;
  Fts3SegReader **__s_00;
  sqlite3_int64 sVar21;
  sqlite3_int64 sVar22;
  Fts3Table *pnLoad;
  char *pcVar23;
  byte *__src;
  i64 nLeafData;
  char *aNode;
  void *pvVar24;
  int iVar25;
  ulong uVar26;
  size_t sVar27;
  long lVar28;
  char cVar29;
  long lVar30;
  sqlite3_uint64 sVar31;
  Fts3Table *aDoclist;
  sqlite3_stmt *psVar32;
  int iVar33;
  Fts3SegReader *pSeg;
  long in_FS_OFFSET;
  bool bVar34;
  sqlite3_stmt *local_188;
  sqlite_int64 local_168;
  int local_13c;
  sqlite3_stmt *pFindLevel;
  Blob local_c8;
  int local_ac;
  sqlite3_stmt *pSelect;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  char *pcStack_90;
  undefined1 *local_88;
  char *pcStack_80;
  undefined1 *local_78;
  int nLeaf;
  char *aBlock_1;
  char *aLeaf;
  sqlite3_int64 iEnd;
  int nHintSeg;
  undefined4 uStack_44;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8.a = (char *)0x0;
  local_c8.n = 0;
  local_c8.nAlloc = 0;
  __s = (int *)sqlite3_malloc64(0x328);
  if (__s == (int *)0x0) {
    iVar9 = 7;
LAB_001b92f3:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return iVar9;
  }
  pSelect = (sqlite3_stmt *)0x0;
  local_c8._8_8_ = local_c8._8_8_ & 0xffffffff00000000;
  iVar9 = fts3SqlStmt(p,0x16,&pSelect,(sqlite3_value **)0x0);
  psVar32 = pSelect;
  _nHintSeg = (sqlite3_stmt *)CONCAT44(uStack_44,iVar9);
  if (iVar9 == 0) {
    sqlite3_bind_int64(pSelect,1,1);
    iVar9 = sqlite3_step(psVar32);
    bVar5 = true;
    iVar25 = 0;
    if (iVar9 == 100) {
      pvVar18 = sqlite3_column_blob(psVar32,0);
      iVar9 = sqlite3_column_bytes(psVar32,0);
      iVar25 = 0;
      if (pvVar18 != (void *)0x0) {
        blobGrowBuffer(&local_c8,iVar9,&nHintSeg);
        if (nHintSeg == 0) {
          if (local_c8.a != (char *)0x0) {
            memcpy(local_c8.a,pvVar18,(long)iVar9);
          }
          local_c8.n = iVar9;
          iVar25 = 0;
        }
        else {
          bVar5 = false;
          iVar25 = nHintSeg;
        }
      }
    }
    iVar9 = sqlite3_reset(psVar32);
    if (!bVar5) {
      iVar9 = iVar25;
    }
  }
  pCsr = (Fts3MultiSegReader *)(__s + 0xb4);
  iVar25 = 2;
  if (2 < nMin) {
    iVar25 = nMin;
  }
  plVar1 = (long *)(__s + 0xe);
  pnByte = (i64 *)(__s + 10);
  local_188 = (sqlite3_stmt *)0x0;
  bVar5 = false;
  local_13c = nMerge;
LAB_001b7826:
  if ((iVar9 != 0) || (local_13c < 1)) goto LAB_001b924b;
  iVar14 = p->nIndex;
  pFindLevel = (sqlite3_stmt *)0x0;
  fts3SqlStmt(p,0x1c,&pFindLevel,(sqlite3_value **)0x0);
  psVar32 = pFindLevel;
  sqlite3_bind_int(pFindLevel,1,iVar25);
  iVar9 = sqlite3_step(psVar32);
  uVar10 = 0xffffffff;
  if (iVar9 == 100) {
    local_188 = (sqlite3_stmt *)sqlite3_column_int64(psVar32,0);
    uVar10 = sqlite3_column_int(psVar32,1);
  }
  lVar28 = (long)iVar14 << 10;
  local_ac = sqlite3_reset(psVar32);
  uVar6 = local_c8._8_8_;
  pcVar23 = local_c8.a;
  iVar9 = local_c8.n;
  if (local_c8.n == 0 || local_ac != 0) {
    bVar4 = 0;
  }
  else {
    pSelect = (sqlite3_stmt *)0x0;
    _nHintSeg = (sqlite3_stmt *)((ulong)_nHintSeg & 0xffffffff00000000);
    iVar33 = 0x10b;
    if (-1 < local_c8.a[(long)local_c8.n + -1]) {
      uVar19 = (long)local_c8.n - 1;
      uVar11 = (uint)uVar19;
      while (uVar12 = (uint)uVar19, 0 < (int)uVar12) {
        if (-1 < local_c8.a[(uVar19 & 0xffffffff) - 1]) goto LAB_001b7956;
        uVar19 = (ulong)(uVar12 - 1);
      }
      uVar12 = (int)uVar11 >> 0x1f & uVar11;
      if (local_c8.n < 1) {
LAB_001b7956:
        lVar30 = 0;
        do {
          lVar20 = lVar30;
          iVar16 = (int)lVar20;
          if ((int)(iVar16 + uVar12) < 2) break;
          lVar30 = lVar20 + -1;
        } while (local_c8.a[(ulong)(iVar16 + uVar12) - 2] < '\0');
        iVar33 = iVar16 + uVar12 + -1;
        local_c8.n = iVar33;
        iVar13 = sqlite3Fts3GetVarintU
                           (local_c8.a + lVar20 + (int)(uVar12 - 1),(sqlite_uint64 *)&pSelect);
        iVar33 = iVar33 + iVar13;
        cVar29 = pcVar23[iVar33];
        if (cVar29 < '\0') {
          iVar15 = sqlite3Fts3GetVarint32(pcVar23 + iVar33,&nHintSeg);
        }
        else {
          _nHintSeg = (sqlite3_stmt *)CONCAT44(uStack_44,(int)cVar29);
          iVar15 = 1;
        }
        iVar33 = 0x10b;
        if (((iVar9 - uVar12) - (iVar13 + iVar15)) + 1 == iVar16) {
          iVar33 = 0;
        }
      }
    }
    local_ac = iVar33;
    if (((int)uVar10 < 0) || ((long)pSelect % lVar28 <= (long)local_188 % lVar28)) {
      if ((int)uVar10 <= nMin) {
        uVar10 = nMin;
      }
      if (nHintSeg <= (int)uVar10) {
        uVar10 = nHintSeg;
      }
      bVar4 = 1;
      local_188 = pSelect;
      bVar5 = true;
    }
    else {
      local_c8._8_8_ = CONCAT44(local_c8.nAlloc,iVar9);
      bVar4 = 0;
    }
  }
  iVar33 = local_ac;
  pnLoad = (Fts3Table *)(uVar6 & 0xffffffff);
  iVar9 = local_ac;
  if ((((int)uVar10 < 1) || (iVar9 = 0x10b, (long)local_188 < 0)) ||
     ((long)iVar14 << 0x2a < (long)local_188)) goto LAB_001b924b;
  memset(__s,0,0x328);
  __s[0xb2] = 1;
  iVar14 = local_ac;
  iVar9 = iVar33;
  if (iVar33 == 0) {
    pSelect = (sqlite3_stmt *)0x0;
    iVar33 = 0;
    iVar14 = fts3SqlStmt(p,8,&pSelect,(sqlite3_value **)0x0);
    psVar32 = pSelect;
    if (iVar14 == 0) {
      sqlite3_bind_int64(pSelect,1,(sqlite_int64)(local_188 + 1));
      sqlite3_step(psVar32);
      iVar33 = sqlite3_column_int(psVar32,0);
      iVar14 = sqlite3_reset(psVar32);
    }
    if (!(bool)(iVar33 != 0 & (iVar33 != 1 | bVar4 ^ 1))) {
      pSelect = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
      local_ac = iVar14;
      iVar14 = fts3SqlStmt(p,0xf,&pSelect,(sqlite3_value **)0x0);
      psVar32 = pSelect;
      iVar9 = iVar14;
      if (iVar14 != 0) goto LAB_001b7c9d;
      sqlite3_bind_int64(pSelect,1,(sqlite_int64)(local_188 + 2));
      sqlite3_bind_int64(psVar32,2,((ulong)(local_188 + 1) & 0x7ffffffffffffc00) + 0x400);
      iVar9 = sqlite3_step(psVar32);
      bVar34 = true;
      if (iVar9 == 100) {
        iVar9 = sqlite3_column_type(psVar32,0);
        bVar34 = iVar9 != 5;
      }
      iVar14 = sqlite3_reset(psVar32);
      if (!bVar34) {
        *(byte *)(__s + 0xb2) = *(byte *)(__s + 0xb2) | 2;
      }
    }
    iVar9 = iVar14;
    if (iVar14 == 0) {
      pSelect = (sqlite3_stmt *)0x0;
      __s[0xc4] = 0;
      __s[0xc5] = 0;
      __s[0xc6] = 0;
      __s[199] = 0;
      __s[0xc0] = 0;
      __s[0xc1] = 0;
      __s[0xc2] = 0;
      __s[0xc3] = 0;
      __s[0xbc] = 0;
      __s[0xbd] = 0;
      __s[0xbe] = 0;
      __s[0xbf] = 0;
      __s[200] = 0;
      __s[0xc9] = 0;
      __s[0xb8] = 0;
      __s[0xb9] = 0;
      __s[0xba] = 0;
      __s[0xbb] = 0;
      pCsr->apSegment = (Fts3SegReader **)0x0;
      __s[0xb6] = 0;
      __s[0xb7] = 0;
      sVar31 = (ulong)uVar10 * 8;
      local_ac = iVar14;
      __s_00 = (Fts3SegReader **)sqlite3_malloc64(sVar31);
      pCsr->apSegment = __s_00;
      iVar14 = 7;
      iVar9 = 7;
      if (__s_00 != (Fts3SegReader **)0x0) {
        memset(__s_00,0,sVar31);
        iVar14 = fts3SqlStmt(p,0xc,&pSelect,(sqlite3_value **)0x0);
        psVar32 = pSelect;
        iVar9 = iVar14;
        if (iVar14 == 0) {
          sqlite3_bind_int64(pSelect,1,(sqlite_int64)local_188);
          lVar28 = 0;
          iVar9 = 0;
          for (uVar19 = 0;
              ((iVar9 == 0 && (iVar14 = sqlite3_step(psVar32), iVar14 == 100)) && (uVar19 < uVar10))
              ; uVar19 = uVar19 + 1) {
            sVar21 = sqlite3_column_int64(psVar32,1);
            sVar22 = sqlite3_column_int64(psVar32,2);
            pnLoad = (Fts3Table *)sqlite3_column_int64(psVar32,3);
            pcVar23 = (char *)sqlite3_column_blob(psVar32,4);
            iVar9 = sqlite3_column_bytes(psVar32,4);
            iVar9 = sqlite3Fts3SegReaderNew
                              ((int)uVar19,0,sVar21,sVar22,(sqlite3_int64)pnLoad,pcVar23,iVar9,
                               (Fts3SegReader **)(*(long *)(__s + 0xb4) + lVar28));
            __s[0xb6] = __s[0xb6] + 1;
            lVar28 = lVar28 + 8;
          }
          local_ac = sqlite3_reset(psVar32);
          if (iVar9 != 0) {
            local_ac = iVar9;
          }
          iVar14 = local_ac;
          iVar9 = local_ac;
          if (((local_ac == 0) && (iVar9 = 0, __s[0xb6] == uVar10)) &&
             (local_ac = sqlite3Fts3SegReaderStart(p,pCsr,(Fts3SegFilter *)(__s + 0xae)),
             iVar14 = local_ac, iVar9 = local_ac, local_ac == 0)) {
            iVar9 = sqlite3Fts3SegReaderStep(p,pCsr);
            local_ac = iVar9;
            if ((iVar9 == 100) || (iVar9 == 0)) {
              if ((bool)(bVar4 ^ 1) || iVar33 < 1) {
                pSelect = (sqlite3_stmt *)0x0;
                _nHintSeg = (sqlite3_stmt *)0x0;
                iVar14 = fts3SqlStmt(p,0x1d,&pSelect,(sqlite3_value **)0x0);
                psVar32 = pSelect;
                if (iVar14 == 0) {
                  sqlite3_bind_int64(pSelect,1,(sqlite_int64)local_188);
                  sqlite3_bind_int64(psVar32,2,(long)__s[0xb6]);
                  iVar14 = sqlite3_step(psVar32);
                  iVar16 = 0;
                  if (iVar14 == 100) {
                    iVar16 = sqlite3_column_int(psVar32,0);
                  }
                  iVar14 = sqlite3_reset(psVar32);
                  if ((iVar14 == 0) &&
                     (iVar14 = fts3SqlStmt(p,10,(sqlite3_stmt **)&nHintSeg,(sqlite3_value **)0x0),
                     psVar32 = _nHintSeg, iVar14 == 0)) {
                    iVar14 = sqlite3_step(_nHintSeg);
                    if (iVar14 == 100) {
                      sVar21 = sqlite3_column_int64(psVar32,0);
                      *(sqlite3_int64 *)(__s + 6) = sVar21;
                      *(sqlite3_int64 *)(__s + 8) = sVar21 + (iVar16 << 4) + -1;
                    }
                    iVar14 = sqlite3_reset(psVar32);
                    if ((iVar14 == 0) &&
                       (iVar14 = fts3WriteSegment(p,*(sqlite3_int64 *)(__s + 8),(char *)0x0,0),
                       iVar14 == 0)) {
                      *(sqlite3_stmt **)(__s + 2) = local_188;
                      *__s = iVar16;
                      __s[4] = iVar33;
                      lVar28 = *(long *)(__s + 6);
                      for (lVar30 = 0x38; lVar30 != 0x2b8; lVar30 = lVar30 + 0x28) {
                        *(long *)((long)__s + lVar30) = lVar28;
                        lVar28 = lVar28 + iVar16;
                      }
                      iVar14 = 0;
                    }
                  }
                }
              }
              else {
                pcVar23 = *(char **)(__s + 0xc2);
                iVar16 = __s[0xc4];
                _nHintSeg = (sqlite3_stmt *)0x0;
                iVar14 = fts3SqlStmt(p,0x20,(sqlite3_stmt **)&nHintSeg,(sqlite3_value **)0x0);
                psVar32 = _nHintSeg;
                if (iVar14 == 0) {
                  iEnd = 0;
                  sqlite3_bind_int64(_nHintSeg,1,(sqlite_int64)(local_188 + 1));
                  sqlite3_bind_int(psVar32,2,iVar33 + -1);
                  iVar14 = sqlite3_step(psVar32);
                  if (iVar14 == 100) {
                    sVar21 = sqlite3_column_int64(psVar32,1);
                    sVar22 = sqlite3_column_int64(psVar32,2);
                    fts3ReadEndBlockField(psVar32,3,&iEnd,pnByte);
                    lVar28 = *pnByte;
                    if (lVar28 < 0) {
                      *pnByte = -lVar28;
                      lVar28 = 1;
                    }
                    *(bool *)(__s + 0xc) = lVar28 == 0;
                    iVar13 = sqlite3_column_bytes(psVar32,4);
                    __src = (byte *)sqlite3_column_blob(psVar32,4);
                    iValue = iEnd;
                    if (__src == (byte *)0x0) {
                      sqlite3_reset(psVar32);
                      iVar14 = 7;
                      if (iVar13 == 0) {
                        iVar14 = 0x10b;
                      }
                    }
                    else {
                      pSelect = (sqlite3_stmt *)0x0;
                      bVar34 = false;
                      iVar15 = fts3SqlStmt(p,0x22,&pSelect,(sqlite3_value **)0x0);
                      pStmt = pSelect;
                      if (iVar15 == 0) {
                        sqlite3_bind_int64(pSelect,1,iValue);
                        iVar14 = sqlite3_step(pStmt);
                        bVar34 = iVar14 == 100;
                        iVar15 = sqlite3_reset(pStmt);
                      }
                      aBlock_1 = (char *)CONCAT44(aBlock_1._4_4_,iVar15);
                      if (bVar34 && iVar15 == 0) {
                        aLeaf = (char *)0x0;
                        nLeaf = 0;
                        iVar15 = sqlite3Fts3ReadBlock(p,sVar22,&aLeaf,&nLeaf,(int *)pnLoad);
                        aBlock_1 = (char *)CONCAT44(aBlock_1._4_4_,iVar15);
                        bVar8 = true;
                        if (iVar15 == 0) {
                          local_78 = &DAT_aaaaaaaaaaaaaaaa;
                          local_88 = &DAT_aaaaaaaaaaaaaaaa;
                          pcStack_80 = &DAT_aaaaaaaaaaaaaaaa;
                          local_98 = &DAT_aaaaaaaaaaaaaaaa;
                          pcStack_90 = &DAT_aaaaaaaaaaaaaaaa;
                          pSelect = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
                          puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
                          iVar15 = nodeReaderInit((NodeReader *)&pSelect,aLeaf,nLeaf);
                          while ((pcVar7 = pcStack_90, iVar15 == 0 &&
                                 (pSelect != (sqlite3_stmt *)0x0))) {
                            iVar15 = nodeReaderNext((NodeReader *)&pSelect);
                          }
                          aBlock_1 = (char *)CONCAT44(aBlock_1._4_4_,iVar15);
                          iVar14 = fts3TermCmp(pcVar23,iVar16,pcStack_90,(int)local_88);
                          if (iVar14 < 1) {
                            bVar34 = false;
                          }
                          sqlite3_free(pcVar7);
                          bVar8 = bVar34;
                        }
                        bVar34 = bVar8;
                        sqlite3_free(aLeaf);
                      }
                      iVar16 = iVar15;
                      if ((iVar15 == 0) && (bVar34)) {
                        bVar4 = *__src;
                        uVar10 = (uint)(char)bVar4;
                        if (0xe < (byte)(bVar4 - 1)) {
                          sqlite3_reset(psVar32);
                          iVar14 = 0x10b;
                          goto LAB_001b8586;
                        }
                        iVar14 = (((int)iValue - (int)sVar21) + 1) / 0x10;
                        *__s = iVar14;
                        *(sqlite3_int64 *)(__s + 6) = sVar21;
                        *(sqlite3_int64 *)(__s + 8) = iValue;
                        *(sqlite3_stmt **)(__s + 2) = local_188;
                        __s[4] = iVar33 + -1;
                        lVar28 = ((ulong)bVar4 + 1) * (long)iVar14 + sVar21;
                        for (lVar30 = (ulong)bVar4 * 0x28; lVar30 != 600; lVar30 = lVar30 + 0x28) {
                          *(long *)((long)__s + lVar30 + 0x60) = lVar28;
                          lVar28 = lVar28 + iVar14;
                        }
                        uVar19 = (ulong)uVar10;
                        plVar1[uVar19 * 5] = sVar21 + (int)(iVar14 * uVar10);
                        iVar14 = p->nNodeSize;
                        if (p->nNodeSize < iVar13) {
                          iVar14 = iVar13;
                        }
                        pnLoad = p;
                        blobGrowBuffer((Blob *)(plVar1 + uVar19 * 5 + 3),iVar14 + 0x14,
                                       (int *)&aBlock_1);
                        pcVar23 = aBlock_1;
                        iVar15 = (int)aBlock_1;
                        if ((int)aBlock_1 == 0) {
                          sVar27 = (size_t)iVar13;
                          memcpy((void *)plVar1[uVar19 * 5 + 3],__src,sVar27);
                          *(int *)(plVar1 + uVar19 * 5 + 4) = iVar13;
                          lVar28 = plVar1[uVar19 * 5 + 3];
                          puVar2 = (undefined8 *)(lVar28 + sVar27);
                          *puVar2 = 0;
                          puVar2[1] = 0;
                          *(undefined4 *)(lVar28 + 0x10 + sVar27) = 0;
                        }
                        uVar19 = (ulong)pcVar23 & 0xffffffff;
                        for (; (iVar16 = (int)uVar19, iVar16 == 0 && (-1 < (int)uVar10));
                            uVar10 = uVar10 - 1) {
                          local_88 = (undefined1 *)0x0;
                          pcStack_80 = (char *)0x0;
                          local_98 = (undefined1 *)0x0;
                          pcStack_90 = (char *)0x0;
                          pSelect = (sqlite3_stmt *)0x0;
                          puStack_a0 = (undefined1 *)0x0;
                          local_78 = (undefined1 *)0x0;
                          uVar26 = (ulong)uVar10;
                          if (*(char **)(__s + uVar26 * 10 + 0x14) == (char *)0x0) {
LAB_001b854c:
                            uVar19 = 0;
                          }
                          else {
                            iVar14 = nodeReaderInit((NodeReader *)&pSelect,
                                                    *(char **)(__s + uVar26 * 10 + 0x14),
                                                    (int)plVar1[uVar26 * 5 + 4]);
                            while ((pSelect != (sqlite3_stmt *)0x0 && (iVar14 == 0))) {
                              iVar14 = nodeReaderNext((NodeReader *)&pSelect);
                            }
                            aBlock_1 = (char *)CONCAT44(aBlock_1._4_4_,iVar14);
                            blobGrowBuffer((Blob *)(plVar1 + uVar26 * 5 + 1),(int)local_88,
                                           (int *)&aBlock_1);
                            uVar19 = (ulong)aBlock_1 & 0xffffffff;
                            iVar15 = (int)aBlock_1;
                            if ((int)aBlock_1 == 0) {
                              if (0 < (long)(int)local_88) {
                                memcpy(((Blob *)(plVar1 + uVar26 * 5 + 1))->a,pcStack_90,
                                       (long)(int)local_88);
                              }
                              *(int *)(plVar1 + uVar26 * 5 + 2) = (int)local_88;
                              if ((int)uVar10 < 1) {
                                iVar15 = 0;
                                goto LAB_001b854c;
                              }
                              aLeaf = (char *)0x0;
                              nLeaf = 0;
                              uVar19 = (ulong)(uVar10 - 1);
                              plVar1[uVar19 * 5] = (long)local_98;
                              iVar33 = sqlite3Fts3ReadBlock
                                                 (p,(sqlite3_int64)local_98,&aLeaf,&nLeaf,
                                                  (int *)pnLoad);
                              iVar14 = nLeaf;
                              aBlock_1 = (char *)CONCAT44(aBlock_1._4_4_,iVar33);
                              iVar33 = p->nNodeSize;
                              if (p->nNodeSize < nLeaf) {
                                iVar33 = nLeaf;
                              }
                              blobGrowBuffer((Blob *)(plVar1 + uVar19 * 5 + 3),iVar33 + 0x14,
                                             (int *)&aBlock_1);
                              pcVar23 = aBlock_1;
                              iVar15 = (int)aBlock_1;
                              if ((int)aBlock_1 == 0) {
                                sVar27 = (size_t)iVar14;
                                memcpy((void *)plVar1[uVar19 * 5 + 3],aLeaf,sVar27);
                                *(int *)(plVar1 + uVar19 * 5 + 4) = iVar14;
                                lVar28 = plVar1[uVar19 * 5 + 3];
                                puVar2 = (undefined8 *)(lVar28 + sVar27);
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                *(undefined4 *)(lVar28 + 0x10 + sVar27) = 0;
                              }
                              sqlite3_free(aLeaf);
                              uVar19 = (ulong)pcVar23 & 0xffffffff;
                            }
                          }
                          sqlite3_free(pcStack_90);
                        }
                      }
                      iVar14 = sqlite3_reset(psVar32);
                      if (iVar16 != 0) {
                        iVar14 = iVar15;
                      }
                    }
                  }
                  else {
                    iVar14 = sqlite3_reset(psVar32);
                  }
                }
              }
LAB_001b8586:
              local_ac = iVar14;
              iVar33 = local_ac;
              bVar34 = bVar5;
              if (local_ac == 0) {
                if (*__s == 0) {
                  iVar33 = 0;
                }
                else {
                  local_ac = 0;
                  iVar14 = 0;
                  if (iVar9 != 0) {
                    do {
                      local_ac = iVar14;
                      pcVar23 = *(char **)(__s + 0xc2);
                      iVar9 = __s[0xc4];
                      aDoclist = *(Fts3Table **)(__s + 0xc6);
                      iVar14 = __s[200];
                      _nHintSeg = (sqlite3_stmt *)((ulong)_nHintSeg & 0xffffffff00000000);
                      iVar33 = fts3PrefixCompress(*(char **)(__s + 0x10),__s[0x12],pcVar23,iVar9);
                      uVar10 = iVar9 - iVar33;
                      if (uVar10 == 0 || iVar9 < iVar33) {
                        iVar33 = 0x10b;
                      }
                      else {
                        iVar16 = sqlite3Fts3VarintLen((long)iVar33);
                        iVar13 = sqlite3Fts3VarintLen((ulong)uVar10);
                        iVar15 = sqlite3Fts3VarintLen((long)iVar14);
                        iVar13 = iVar16 + uVar10 + iVar13 + iVar15 + iVar14;
                        iVar16 = __s[0x16];
                        if (((0 < iVar16) && (p->nNodeSize < iVar13 + iVar16)) &&
                           (*(long *)(__s + 0xe) < (long)*__s + *(long *)(__s + 6))) {
                          iVar16 = fts3WriteSegment(p,*(long *)(__s + 0xe),*(char **)(__s + 0x14),
                                                    iVar16);
                          _nHintSeg = (sqlite3_stmt *)CONCAT44(uStack_44,iVar16);
                          __s[1] = __s[1] + 1;
                          lVar28 = *(long *)(__s + 0xe);
                          if (iVar16 == 0) {
                            iVar33 = iVar33 + 1;
                            cVar29 = '\x01';
                            lVar30 = 0;
                            do {
                              if (lVar30 == 600) {
                                iVar16 = 0;
                                break;
                              }
                              pSelect = (sqlite3_stmt *)((ulong)pSelect & 0xffffffff00000000);
                              iVar16 = *(int *)((long)__s + lVar30 + 0x70);
                              iVar13 = fts3PrefixCompress(*(char **)((long)__s + lVar30 + 0x68),
                                                          iVar16,pcVar23,iVar33);
                              uVar10 = iVar33 - iVar13;
                              if (uVar10 == 0 || iVar33 < iVar13) {
                                iVar16 = 0x10b;
                                break;
                              }
                              sVar31 = (sqlite3_uint64)iVar13;
                              iVar13 = sqlite3Fts3VarintLen(sVar31);
                              uVar19 = (ulong)uVar10;
                              iVar17 = sqlite3Fts3VarintLen(uVar19);
                              iVar17 = iVar13 + uVar10 + iVar17;
                              iVar13 = *(int *)((long)__s + lVar30 + 0x80);
                              if ((iVar16 == 0) || (iVar13 + iVar17 <= p->nNodeSize)) {
                                pBlob = (Blob *)((long)&((Blob *)(__s + 0x1e))->a + lVar30);
                                if (iVar13 == 0) {
                                  blobGrowBuffer(pBlob,p->nNodeSize,(int *)&pSelect);
                                  if ((int)pSelect == 0) {
                                    **(char **)((long)__s + lVar30 + 0x78) = cVar29;
                                    iVar13 = sqlite3Fts3PutVarint
                                                       ((char *)(*(long *)((long)__s + lVar30 + 0x78
                                                                          ) + 1),lVar28);
                                    iVar13 = iVar13 + 1;
                                    *(int *)((long)__s + lVar30 + 0x80) = iVar13;
                                  }
                                  else {
                                    iVar13 = *(int *)((long)__s + lVar30 + 0x80);
                                  }
                                }
                                blobGrowBuffer(pBlob,iVar13 + iVar17,(int *)&pSelect);
                                blobGrowBuffer((Blob *)((long)__s + lVar30 + 0x68),iVar33,
                                               (int *)&pSelect);
                                if ((int)pSelect == 0) {
                                  iVar16 = *(int *)((long)__s + lVar30 + 0x80);
                                  if (*(int *)((long)__s + lVar30 + 0x70) != 0) {
                                    iVar16 = sqlite3Fts3PutVarint
                                                       ((char *)((long)iVar16 +
                                                                *(long *)((long)__s + lVar30 + 0x78)
                                                                ),sVar31);
                                    iVar16 = iVar16 + *(int *)((long)__s + lVar30 + 0x80);
                                    *(int *)((long)__s + lVar30 + 0x80) = iVar16;
                                  }
                                  iVar16 = sqlite3Fts3PutVarint
                                                     ((char *)((long)iVar16 +
                                                              *(long *)((long)__s + lVar30 + 0x78)),
                                                      uVar19);
                                  lVar28 = (long)iVar16 + (long)*(int *)((long)__s + lVar30 + 0x80);
                                  *(int *)((long)__s + lVar30 + 0x80) = (int)lVar28;
                                  memcpy((void *)(lVar28 + *(long *)((long)__s + lVar30 + 0x78)),
                                         pcVar23 + sVar31,uVar19);
                                  piVar3 = (int *)((long)__s + lVar30 + 0x80);
                                  *piVar3 = *piVar3 + uVar10;
                                  memcpy(*(void **)((long)__s + lVar30 + 0x68),pcVar23,(long)iVar33)
                                  ;
                                  iVar16 = 0;
                                  lVar28 = 0;
                                  iVar13 = iVar33;
                                  goto LAB_001b8a37;
                                }
                                lVar28 = 0;
                                iVar16 = (int)pSelect;
                              }
                              else {
                                iVar16 = fts3WriteSegment(p,*(sqlite3_int64 *)
                                                             ((long)__s + lVar30 + 0x60),
                                                          *(char **)((long)__s + lVar30 + 0x78),
                                                          iVar13);
                                **(char **)((long)__s + lVar30 + 0x78) = cVar29;
                                iVar13 = sqlite3Fts3PutVarint
                                                   ((char *)(*(long *)((long)__s + lVar30 + 0x78) +
                                                            1),lVar28 + 1);
                                *(int *)((long)__s + lVar30 + 0x80) = iVar13 + 1;
                                lVar28 = *(long *)((long)__s + lVar30 + 0x60);
                                *(long *)((long)__s + lVar30 + 0x60) = lVar28 + 1;
                                iVar13 = 0;
LAB_001b8a37:
                                *(int *)((long)__s + lVar30 + 0x70) = iVar13;
                              }
                              if (iVar16 != 0) break;
                              cVar29 = cVar29 + '\x01';
                              lVar30 = lVar30 + 0x28;
                            } while (lVar28 != 0);
                            _nHintSeg = (sqlite3_stmt *)CONCAT44(uStack_44,iVar16);
                            lVar28 = *plVar1;
                          }
                          *(long *)(__s + 0xe) = lVar28 + 1;
                          __s[0x12] = 0;
                          __s[0x16] = 0;
                          iVar33 = sqlite3Fts3VarintLen((long)iVar9);
                          iVar13 = iVar33 + iVar15 + iVar14 + iVar9 + 1;
                          iVar16 = 0;
                        }
                        *pnByte = *pnByte + (long)iVar13;
                        blobGrowBuffer((Blob *)(__s + 0x14),iVar13 + iVar16,&nHintSeg);
                        iVar33 = nHintSeg;
                        if (nHintSeg == 0) {
                          if (__s[0x16] == 0) {
                            __s[0x16] = 1;
                            **(undefined1 **)(__s + 0x14) = 0;
                          }
                          iVar33 = fts3AppendToNode((Blob *)(__s + 0x14),(Blob *)(__s + 0x10),
                                                    pcVar23,iVar9,(char *)aDoclist,iVar14);
                          pnLoad = aDoclist;
                          if (iVar33 == 0) {
                            iVar33 = sqlite3Fts3SegReaderStep(p,pCsr);
                            pnLoad = aDoclist;
                          }
                        }
                      }
                      uVar10 = __s[1];
                      if ((local_13c <= (int)uVar10) && (iVar33 == 100)) {
                        local_ac = 0;
                        goto LAB_001b8c2b;
                      }
                      iVar14 = local_ac;
                    } while (iVar33 == 100);
                    local_ac = iVar33;
                    if (iVar33 != 0) goto LAB_001b8597;
                  }
                  uVar10 = __s[1];
LAB_001b8c2b:
                  iVar9 = __s[0xb6];
                  iVar14 = 0;
                  uVar11 = 0;
                  while ((0 < iVar9 && (iVar14 == 0))) {
                    iVar9 = iVar9 + -1;
                    uVar19 = (ulong)(uint)__s[0xb6];
                    if (__s[0xb6] < 1) {
                      uVar19 = 0;
                    }
                    uVar26 = 0;
                    pSeg = (Fts3SegReader *)0x0;
                    do {
                      if (uVar19 == uVar26) break;
                      pSeg = pCsr->apSegment[uVar26];
                      uVar26 = uVar26 + 1;
                    } while (pSeg->iIdx != iVar9);
                    if (pSeg->aNode == (char *)0x0) {
                      iVar14 = fts3DeleteSegment(p,pSeg);
                      if (iVar14 == 0) {
                        iVar33 = pSeg->iIdx;
                        pSelect = (sqlite3_stmt *)0x0;
                        iVar14 = fts3SqlStmt(p,0x1e,&pSelect,(sqlite3_value **)0x0);
                        psVar32 = pSelect;
                        if (iVar14 == 0) {
                          sqlite3_bind_int64(pSelect,1,(sqlite_int64)local_188);
                          sqlite3_bind_int(psVar32,2,iVar33);
                          sqlite3_step(psVar32);
                          iVar14 = sqlite3_reset(psVar32);
                        }
                      }
                    }
                    else {
                      pcVar23 = pSeg->zTerm;
                      iVar33 = pSeg->iIdx;
                      uVar12 = pSeg->nTerm;
                      pSelect = (sqlite3_stmt *)0x0;
                      puStack_a0 = (undefined1 *)0x0;
                      iEnd = 0;
                      _nHintSeg = (sqlite3_stmt *)0x0;
                      uStack_40._0_4_ = 0;
                      uStack_40._4_4_ = 0;
                      aLeaf = (char *)0x0;
                      iVar14 = fts3SqlStmt(p,0x20,(sqlite3_stmt **)&aLeaf,(sqlite3_value **)0x0);
                      pcVar7 = aLeaf;
                      local_168 = 0;
                      if (iVar14 == 0) {
                        sqlite3_bind_int64((sqlite3_stmt *)aLeaf,1,(sqlite_int64)local_188);
                        sqlite3_bind_int((sqlite3_stmt *)pcVar7,2,iVar33);
                        iVar14 = sqlite3_step((sqlite3_stmt *)pcVar7);
                        if (iVar14 == 100) {
                          aNode = (char *)sqlite3_column_blob((sqlite3_stmt *)pcVar7,4);
                          iVar14 = sqlite3_column_bytes((sqlite3_stmt *)pcVar7,4);
                          local_168 = sqlite3_column_int64((sqlite3_stmt *)pcVar7,1);
                          pnLoad = (Fts3Table *)(ulong)uVar12;
                          iVar16 = fts3TruncateNode(aNode,iVar14,(Blob *)&pSelect,pcVar23,uVar12,
                                                    &iEnd);
                        }
                        else {
                          local_168 = 0;
                          iVar16 = 0;
                        }
                        iVar14 = sqlite3_reset((sqlite3_stmt *)pcVar7);
                        if (iVar16 != 0) {
                          iVar14 = iVar16;
                        }
                      }
                      lVar28 = 0;
                      while ((sVar21 = iEnd, iVar14 == 0 && (iEnd != 0))) {
                        aBlock_1 = (char *)0x0;
                        nLeaf = 0;
                        iVar14 = sqlite3Fts3ReadBlock(p,iEnd,&aBlock_1,&nLeaf,(int *)pnLoad);
                        if (iVar14 == 0) {
                          pnLoad = (Fts3Table *)(ulong)uVar12;
                          iVar14 = fts3TruncateNode(aBlock_1,nLeaf,(Blob *)&nHintSeg,pcVar23,uVar12,
                                                    &iEnd);
                          if (iVar14 == 0) {
                            iVar14 = fts3WriteSegment(p,sVar21,(char *)_nHintSeg,(int)uStack_40);
                          }
                        }
                        sqlite3_free(aBlock_1);
                        lVar28 = sVar21;
                      }
                      if ((lVar28 != 0) && (iVar14 == 0)) {
                        aBlock_1 = (char *)0x0;
                        iVar14 = fts3SqlStmt(p,0x11,(sqlite3_stmt **)&aBlock_1,(sqlite3_value **)0x0
                                            );
                        pcVar23 = aBlock_1;
                        if (iVar14 == 0) {
                          sqlite3_bind_int64((sqlite3_stmt *)aBlock_1,1,local_168);
                          sqlite3_bind_int64((sqlite3_stmt *)pcVar23,2,lVar28 + -1);
                          sqlite3_step((sqlite3_stmt *)pcVar23);
                          iVar14 = sqlite3_reset((sqlite3_stmt *)pcVar23);
                        }
                      }
                      if (iVar14 == 0) {
                        aBlock_1 = (char *)0x0;
                        iVar14 = fts3SqlStmt(p,0x21,(sqlite3_stmt **)&aBlock_1,(sqlite3_value **)0x0
                                            );
                        pcVar23 = aBlock_1;
                        if (iVar14 == 0) {
                          sqlite3_bind_int64((sqlite3_stmt *)aBlock_1,1,lVar28);
                          pnLoad = (Fts3Table *)0x0;
                          sqlite3_bind_blob((sqlite3_stmt *)pcVar23,2,pSelect,(int)puStack_a0,
                                            (_func_void_void_ptr *)0x0);
                          sqlite3_bind_int64((sqlite3_stmt *)pcVar23,3,(sqlite_int64)local_188);
                          sqlite3_bind_int((sqlite3_stmt *)pcVar23,4,iVar33);
                          sqlite3_step((sqlite3_stmt *)pcVar23);
                          iVar14 = sqlite3_reset((sqlite3_stmt *)pcVar23);
                          sqlite3_bind_null((sqlite3_stmt *)pcVar23,2);
                        }
                      }
                      sqlite3_free(pSelect);
                      sqlite3_free(_nHintSeg);
                      uVar11 = uVar11 + 1;
                    }
                  }
                  if ((iVar14 == 0) && (iVar14 = 0, uVar11 != __s[0xb6])) {
                    pSelect = (sqlite3_stmt *)0x0;
                    _nHintSeg = (sqlite3_stmt *)0x0;
                    iVar14 = fts3SqlStmt(p,0x23,&pSelect,(sqlite3_value **)0x0);
                    psVar32 = pSelect;
                    if (iVar14 == 0) {
                      sqlite3_bind_int64(pSelect,1,(sqlite_int64)local_188);
                      iVar33 = 0;
                      uVar19 = 0;
                      iVar9 = 0;
                      pvVar18 = (void *)0x0;
                      while (iVar16 = sqlite3_step(psVar32), iVar16 == 100) {
                        pvVar24 = pvVar18;
                        if ((long)iVar9 <= (long)uVar19) {
                          pvVar24 = sqlite3_realloc64(pvVar18,(long)iVar9 * 4 + 0x40);
                          if (pvVar24 == (void *)0x0) {
                            iVar33 = 7;
                            break;
                          }
                          iVar9 = iVar9 + 0x10;
                        }
                        iVar14 = sqlite3_column_int(psVar32,0);
                        *(int *)((long)pvVar24 + uVar19 * 4) = iVar14;
                        uVar19 = uVar19 + 1;
                        pvVar18 = pvVar24;
                      }
                      iVar14 = sqlite3_reset(psVar32);
                      if (iVar16 == 100) {
                        iVar14 = iVar33;
                      }
                      psVar32 = _nHintSeg;
                      if ((iVar14 == 0) &&
                         (iVar14 = fts3SqlStmt(p,0x1f,(sqlite3_stmt **)&nHintSeg,
                                               (sqlite3_value **)0x0), psVar32 = _nHintSeg,
                         iVar14 == 0)) {
                        sqlite3_bind_int64(_nHintSeg,2,(sqlite_int64)local_188);
                        iVar14 = 0;
                      }
                    }
                    else {
                      pvVar18 = (void *)0x0;
                      uVar19 = 0;
                      psVar32 = (sqlite3_stmt *)0x0;
                    }
                    p->bIgnoreSavepoint = '\x01';
                    for (uVar26 = 0; (iVar14 == 0 && (uVar26 < (uVar19 & 0xffffffff)));
                        uVar26 = uVar26 + 1) {
                      uVar12 = *(uint *)((long)pvVar18 + uVar26 * 4);
                      iVar14 = 0;
                      if (uVar26 != uVar12) {
                        sqlite3_bind_int(psVar32,3,uVar12);
                        sqlite3_bind_int(psVar32,1,(int)uVar26);
                        sqlite3_step(psVar32);
                        iVar14 = sqlite3_reset(psVar32);
                      }
                    }
                    p->bIgnoreSavepoint = '\0';
                    sqlite3_free(pvVar18);
                  }
                  local_ac = iVar14;
                  bVar34 = true;
                  local_13c = local_13c + ~uVar10;
                  if (uVar11 == 0) {
                    bVar8 = true;
                    iVar33 = local_ac;
                    goto LAB_001b85a1;
                  }
                  blobGrowBuffer(&local_c8,local_c8.n + 0x14,&local_ac);
                  pcVar23 = local_c8.a;
                  iVar33 = local_ac;
                  if (local_ac == 0) {
                    lVar28 = (long)local_c8.n;
                    iVar9 = sqlite3Fts3PutVarint(local_c8.a + lVar28,(sqlite_int64)local_188);
                    lVar28 = iVar9 + lVar28;
                    iVar9 = sqlite3Fts3PutVarint(pcVar23 + lVar28,(ulong)uVar11);
                    local_c8.n = iVar9 + (int)lVar28;
                    iVar33 = 0;
                  }
                }
              }
LAB_001b8597:
              *pnByte = -*pnByte;
              bVar8 = false;
              bVar5 = bVar34;
LAB_001b85a1:
              pSelect = (sqlite3_stmt *)CONCAT44(pSelect._4_4_,iVar33);
              uVar10 = 0xf;
LAB_001b85ac:
              if (-1 < (int)uVar10) {
                uVar19 = (ulong)uVar10;
                if (__s[uVar19 * 10 + 0x16] < 1) goto code_r0x001b85c3;
                if (uVar10 == 0) {
                  blobGrowBuffer((Blob *)(__s + 0x1e),0xb,(int *)&pSelect);
                  uVar10 = 1;
                  iVar33 = (int)pSelect;
                  if ((int)pSelect == 0) {
                    **(undefined1 **)(__s + 0x1e) = 1;
                    iVar9 = sqlite3Fts3PutVarint
                                      ((char *)(*(long *)(__s + 0x1e) + 1),
                                       *(sqlite_int64 *)(__s + 0xe));
                    __s[0x20] = iVar9 + 1;
                    iVar33 = 0;
                    uVar10 = 1;
                  }
                }
                uVar19 = (ulong)uVar10;
                for (lVar28 = 0; uVar19 * 0x28 - lVar28 != 0; lVar28 = lVar28 + 0x28) {
                  iVar9 = *(int *)((long)__s + lVar28 + 0x58);
                  if ((0 < iVar9) && (iVar33 == 0)) {
                    iVar33 = fts3WriteSegment(p,*(sqlite3_int64 *)((long)__s + lVar28 + 0x38),
                                              *(char **)((long)__s + lVar28 + 0x50),iVar9);
                  }
                  sqlite3_free(*(void **)((long)__s + lVar28 + 0x50));
                  sqlite3_free(*(void **)((long)__s + lVar28 + 0x40));
                }
                if (iVar33 == 0) {
                  if ((char)__s[0xc] == '\0') {
                    nLeafData = *pnByte;
                  }
                  else {
                    nLeafData = 0;
                  }
                  iVar33 = fts3WriteSegdir(p,*(long *)(__s + 2) + 1,__s[4],
                                           *(sqlite3_int64 *)(__s + 6),*(sqlite3_int64 *)(__s + 0xe)
                                           ,*(sqlite3_int64 *)(__s + 8),nLeafData,
                                           (char *)plVar1[uVar19 * 5 + 3],
                                           (int)plVar1[uVar19 * 5 + 4]);
                }
                sqlite3_free((void *)plVar1[uVar19 * 5 + 3]);
                sqlite3_free((void *)plVar1[uVar19 * 5 + 1]);
                local_ac = iVar33;
              }
              iVar14 = local_ac;
              iVar9 = iVar33;
              if ((bVar8) && ((char)__s[0xc] == '\0')) {
                fts3PromoteSegments(p,(sqlite3_int64)(local_188 + 1),*pnByte);
                iVar14 = local_ac;
              }
              goto LAB_001b7c9d;
            }
            sqlite3Fts3SegReaderFinish(pCsr);
LAB_001b924b:
            if ((bVar5) && (iVar9 == 0)) {
              pSelect = (sqlite3_stmt *)0x0;
              iVar9 = fts3SqlStmt(p,0x17,&pSelect,(sqlite3_value **)0x0);
              psVar32 = pSelect;
              if (iVar9 == 0) {
                sqlite3_bind_int64(pSelect,1,1);
                sqlite3_bind_blob(psVar32,2,local_c8.a,local_c8.n,(_func_void_void_ptr *)0x0);
                sqlite3_step(psVar32);
                iVar9 = sqlite3_reset(psVar32);
                sqlite3_bind_null(psVar32,2);
              }
            }
            sqlite3_free(__s);
            sqlite3_free(local_c8.a);
            goto LAB_001b92f3;
          }
        }
      }
    }
  }
LAB_001b7c9d:
  local_ac = iVar14;
  sqlite3Fts3SegReaderFinish(pCsr);
  goto LAB_001b7826;
code_r0x001b85c3:
  sqlite3_free((void *)plVar1[uVar19 * 5 + 3]);
  sqlite3_free((void *)plVar1[uVar19 * 5 + 1]);
  uVar10 = uVar10 - 1;
  goto LAB_001b85ac;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3Incrmerge(Fts3Table *p, int nMerge, int nMin){
  int rc;                         /* Return code */
  int nRem = nMerge;              /* Number of leaf pages yet to  be written */
  Fts3MultiSegReader *pCsr;       /* Cursor used to read input data */
  Fts3SegFilter *pFilter;         /* Filter used with cursor pCsr */
  IncrmergeWriter *pWriter;       /* Writer object */
  int nSeg = 0;                   /* Number of input segments */
  sqlite3_int64 iAbsLevel = 0;    /* Absolute level number to work on */
  Blob hint = {0, 0, 0};          /* Hint read from %_stat table */
  int bDirtyHint = 0;             /* True if blob 'hint' has been modified */

  /* Allocate space for the cursor, filter and writer objects */
  const int nAlloc = sizeof(*pCsr) + sizeof(*pFilter) + sizeof(*pWriter);
  pWriter = (IncrmergeWriter *)sqlite3_malloc64(nAlloc);
  if( !pWriter ) return SQLITE_NOMEM;
  pFilter = (Fts3SegFilter *)&pWriter[1];
  pCsr = (Fts3MultiSegReader *)&pFilter[1];

  rc = fts3IncrmergeHintLoad(p, &hint);
  while( rc==SQLITE_OK && nRem>0 ){
    const i64 nMod = FTS3_SEGDIR_MAXLEVEL * p->nIndex;
    sqlite3_stmt *pFindLevel = 0; /* SQL used to determine iAbsLevel */
    int bUseHint = 0;             /* True if attempting to append */
    int iIdx = 0;                 /* Largest idx in level (iAbsLevel+1) */

    /* Search the %_segdir table for the absolute level with the smallest
    ** relative level number that contains at least nMin segments, if any.
    ** If one is found, set iAbsLevel to the absolute level number and
    ** nSeg to nMin. If no level with at least nMin segments can be found,
    ** set nSeg to -1.
    */
    rc = fts3SqlStmt(p, SQL_FIND_MERGE_LEVEL, &pFindLevel, 0);
    sqlite3_bind_int(pFindLevel, 1, MAX(2, nMin));
    if( sqlite3_step(pFindLevel)==SQLITE_ROW ){
      iAbsLevel = sqlite3_column_int64(pFindLevel, 0);
      nSeg = sqlite3_column_int(pFindLevel, 1);
      assert( nSeg>=2 );
    }else{
      nSeg = -1;
    }
    rc = sqlite3_reset(pFindLevel);

    /* If the hint read from the %_stat table is not empty, check if the
    ** last entry in it specifies a relative level smaller than or equal
    ** to the level identified by the block above (if any). If so, this
    ** iteration of the loop will work on merging at the hinted level.
    */
    if( rc==SQLITE_OK && hint.n ){
      int nHint = hint.n;
      sqlite3_int64 iHintAbsLevel = 0;      /* Hint level */
      int nHintSeg = 0;                     /* Hint number of segments */

      rc = fts3IncrmergeHintPop(&hint, &iHintAbsLevel, &nHintSeg);
      if( nSeg<0 || (iAbsLevel % nMod) >= (iHintAbsLevel % nMod) ){
        /* Based on the scan in the block above, it is known that there
        ** are no levels with a relative level smaller than that of
        ** iAbsLevel with more than nSeg segments, or if nSeg is -1,
        ** no levels with more than nMin segments. Use this to limit the
        ** value of nHintSeg to avoid a large memory allocation in case the
        ** merge-hint is corrupt*/
        iAbsLevel = iHintAbsLevel;
        nSeg = MIN(MAX(nMin,nSeg), nHintSeg);
        bUseHint = 1;
        bDirtyHint = 1;
      }else{
        /* This undoes the effect of the HintPop() above - so that no entry
        ** is removed from the hint blob.  */
        hint.n = nHint;
      }
    }

    /* If nSeg is less that zero, then there is no level with at least
    ** nMin segments and no hint in the %_stat table. No work to do.
    ** Exit early in this case.  */
    if( nSeg<=0 ) break;

    assert( nMod<=0x7FFFFFFF );
    if( iAbsLevel<0 || iAbsLevel>(nMod<<32) ){
      rc = FTS_CORRUPT_VTAB;
      break;
    }

    /* Open a cursor to iterate through the contents of the oldest nSeg
    ** indexes of absolute level iAbsLevel. If this cursor is opened using
    ** the 'hint' parameters, it is possible that there are less than nSeg
    ** segments available in level iAbsLevel. In this case, no work is
    ** done on iAbsLevel - fall through to the next iteration of the loop
    ** to start work on some other level.  */
    memset(pWriter, 0, nAlloc);
    pFilter->flags = FTS3_SEGMENT_REQUIRE_POS;

    if( rc==SQLITE_OK ){
      rc = fts3IncrmergeOutputIdx(p, iAbsLevel, &iIdx);
      assert( bUseHint==1 || bUseHint==0 );
      if( iIdx==0 || (bUseHint && iIdx==1) ){
        int bIgnore = 0;
        rc = fts3SegmentIsMaxLevel(p, iAbsLevel+1, &bIgnore);
        if( bIgnore ){
          pFilter->flags |= FTS3_SEGMENT_IGNORE_EMPTY;
        }
      }
    }

    if( rc==SQLITE_OK ){
      rc = fts3IncrmergeCsr(p, iAbsLevel, nSeg, pCsr);
    }
    if( SQLITE_OK==rc && pCsr->nSegment==nSeg
     && SQLITE_OK==(rc = sqlite3Fts3SegReaderStart(p, pCsr, pFilter))
    ){
      int bEmpty = 0;
      rc = sqlite3Fts3SegReaderStep(p, pCsr);
      if( rc==SQLITE_OK ){
        bEmpty = 1;
      }else if( rc!=SQLITE_ROW ){
        sqlite3Fts3SegReaderFinish(pCsr);
        break;
      }
      if( bUseHint && iIdx>0 ){
        const char *zKey = pCsr->zTerm;
        int nKey = pCsr->nTerm;
        rc = fts3IncrmergeLoad(p, iAbsLevel, iIdx-1, zKey, nKey, pWriter);
      }else{
        rc = fts3IncrmergeWriter(p, iAbsLevel, iIdx, pCsr, pWriter);
      }

      if( rc==SQLITE_OK && pWriter->nLeafEst ){
        fts3LogMerge(nSeg, iAbsLevel);
        if( bEmpty==0 ){
          do {
            rc = fts3IncrmergeAppend(p, pWriter, pCsr);
            if( rc==SQLITE_OK ) rc = sqlite3Fts3SegReaderStep(p, pCsr);
            if( pWriter->nWork>=nRem && rc==SQLITE_ROW ) rc = SQLITE_OK;
          }while( rc==SQLITE_ROW );
        }

        /* Update or delete the input segments */
        if( rc==SQLITE_OK ){
          nRem -= (1 + pWriter->nWork);
          rc = fts3IncrmergeChomp(p, iAbsLevel, pCsr, &nSeg);
          if( nSeg!=0 ){
            bDirtyHint = 1;
            fts3IncrmergeHintPush(&hint, iAbsLevel, nSeg, &rc);
          }
        }
      }

      if( nSeg!=0 ){
        pWriter->nLeafData = pWriter->nLeafData * -1;
      }
      fts3IncrmergeRelease(p, pWriter, &rc);
      if( nSeg==0 && pWriter->bNoLeafData==0 ){
        fts3PromoteSegments(p, iAbsLevel+1, pWriter->nLeafData);
      }
    }

    sqlite3Fts3SegReaderFinish(pCsr);
  }

  /* Write the hint values into the %_stat table for the next incr-merger */
  if( bDirtyHint && rc==SQLITE_OK ){
    rc = fts3IncrmergeHintStore(p, &hint);
  }

  sqlite3_free(pWriter);
  sqlite3_free(hint.a);
  return rc;
}